

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void create_file(char *name)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  uv_os_fd_t file;
  int r;
  char *name_local;
  
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&eval_a,name,0x41,0x180,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x56,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  req.bufsml[3].len._0_4_ = (uv_os_fd_t)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)&eval_a);
  req.bufsml[3].len._4_4_ =
       uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&eval_a,(uv_os_fd_t)req.bufsml[3].len,(uv_fs_cb)0x0);
  if ((long)req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x5a,"r","==","0",(long)req.bufsml[3].len._4_4_,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&eval_a);
  return;
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_WRONLY | UV_FS_O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}